

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int log_write_impl(char *name,size_t line,char *func,char *file,log_level_id level,char *message)

{
  log_level_id lVar1;
  log_impl impl_00;
  log_record_ctor in_RCX;
  log_level_id in_R8D;
  log_level_id impl_level;
  log_record_ctor_type record_ctor;
  log_impl impl;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 local_4;
  
  impl_00 = log_singleton_get(in_stack_ffffffffffffff90);
  if (impl_00 == (log_impl)0x0) {
    local_4 = 0;
  }
  else {
    lVar1 = log_impl_level(impl_00);
    if (in_R8D < lVar1) {
      local_4 = 0;
    }
    else {
      local_4 = log_impl_write((log_impl)CONCAT44(in_stack_ffffffffffffffac,in_R8D),in_RCX);
    }
  }
  return local_4;
}

Assistant:

int log_write_impl(const char *name, const size_t line, const char *func, const char *file, const enum log_level_id level, const char *message)
{
	log_impl impl = log_singleton_get(name);

	struct log_record_ctor_type record_ctor;

	enum log_level_id impl_level;

	if (impl == NULL)
	{
		return 0;
	}

	impl_level = log_impl_level(impl);

	if (level < impl_level)
	{
		return 0;
	}

	record_ctor.line = line;
	record_ctor.func = func;
	record_ctor.file = file;
	record_ctor.level = level;
	record_ctor.message = message;
	record_ctor.variable_args = NULL;

	return log_impl_write(impl, &record_ctor);
}